

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

Pseudo * indexed_load(Proc *proc,Pseudo *index_pseudo)

{
  uint uVar1;
  ravitype_t rVar2;
  ravitype_t type;
  Pseudo *pseudo;
  Pseudo *pseudo_00;
  Instruction *insn_00;
  Pseudo *pseudo_01;
  Pseudo *pseudo_02;
  Pseudo *target_pseudo;
  Pseudo *tofree2;
  Pseudo *tofree1;
  Instruction *insn;
  int op;
  Pseudo *key_pseudo;
  Pseudo *container_pseudo;
  uint line_number;
  ravitype_t target_type;
  ravitype_t key_type;
  ravitype_t container_type;
  Pseudo *index_pseudo_local;
  Proc *proc_local;
  
  if (((undefined1  [48])*index_pseudo & (undefined1  [48])0xf) != (undefined1  [48])0xe) {
    __assert_fail("index_pseudo->type == PSEUDO_INDEXED",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                  ,0x524,"Pseudo *indexed_load(Proc *, Pseudo *)");
  }
  if ((*(byte *)((long)&index_pseudo->field_3 + 0xc) >> 1 & 1) != 0) {
    __assert_fail("!index_pseudo->index_info.used",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                  ,0x525,"Pseudo *indexed_load(Proc *, Pseudo *)");
  }
  if ((undefined1  [40])((undefined1  [40])index_pseudo->field_3 & (undefined1  [40])0x100000000) ==
      (undefined1  [40])0x0) {
    uVar1 = (index_pseudo->field_3).range_in_use;
    rVar2 = (index_pseudo->field_3).index_info.key_type;
    type = (index_pseudo->field_3).index_info.target_type;
    pseudo = (index_pseudo->field_3).index_info.container;
    pseudo_00 = (index_pseudo->field_3).index_info.key;
    if (((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      __assert_fail("container_pseudo->type != PSEUDO_INDEXED",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x530,"Pseudo *indexed_load(Proc *, Pseudo *)");
    }
    if (((undefined1  [48])*pseudo_00 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      __assert_fail("key_pseudo->type != PSEUDO_INDEXED",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x531,"Pseudo *indexed_load(Proc *, Pseudo *)");
    }
    insn._4_4_ = op_get;
    if (uVar1 == 0x20) {
      insn._4_4_ = op_iaget;
    }
    else if (uVar1 == 0x40) {
      insn._4_4_ = op_faget;
    }
    else if (uVar1 == 0x80) {
      insn._4_4_ = op_tget;
    }
    if (rVar2 == RAVI_TNUMINT) {
      insn._4_4_ = insn._4_4_ + op_ret;
    }
    else if (rVar2 == RAVI_TSTRING) {
      if ((uVar1 == 0x20) || (uVar1 == 0x40)) {
        __assert_fail("container_type != RAVI_TARRAYINT && container_type != RAVI_TARRAYFLT",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                      ,0x547,"Pseudo *indexed_load(Proc *, Pseudo *)");
      }
      insn._4_4_ = insn._4_4_ + op_add;
    }
    insn_00 = allocate_instruction(proc,insn._4_4_,(index_pseudo->field_3).index_info.line_number);
    pseudo_01 = add_instruction_operand(proc,insn_00,pseudo);
    pseudo_02 = add_instruction_operand(proc,insn_00,pseudo_00);
    free_temp_pseudo(proc,pseudo,false);
    free_temp_pseudo(proc,pseudo_00,false);
    *(byte *)((long)&index_pseudo->field_3 + 0xc) =
         *(byte *)((long)&index_pseudo->field_3 + 0xc) & 0xfd | 2;
    if (pseudo_01 != (Pseudo *)0x0) {
      free_temp_pseudo(proc,pseudo_01,false);
    }
    if (pseudo_02 != (Pseudo *)0x0) {
      free_temp_pseudo(proc,pseudo_02,false);
    }
    proc_local = (Proc *)allocate_temp_pseudo(proc,type,true);
    add_instruction_target(proc,insn_00,(Pseudo *)proc_local);
    add_instruction(proc,insn_00);
  }
  else {
    proc_local = (Proc *)indexed_load_from_global(proc,index_pseudo);
  }
  return (Pseudo *)proc_local;
}

Assistant:

static Pseudo *indexed_load(Proc *proc, Pseudo *index_pseudo)
{
	assert(index_pseudo->type == PSEUDO_INDEXED);
	assert(!index_pseudo->index_info.used);
	if (index_pseudo->index_info.is_global)
		return indexed_load_from_global(proc, index_pseudo);

	ravitype_t container_type = index_pseudo->index_info.container_type;
	ravitype_t key_type = index_pseudo->index_info.key_type;
	ravitype_t target_type = index_pseudo->index_info.target_type;
	unsigned line_number = index_pseudo->index_info.line_number;
	Pseudo *container_pseudo = index_pseudo->index_info.container;
	Pseudo *key_pseudo = index_pseudo->index_info.key;

	assert(container_pseudo->type != PSEUDO_INDEXED);
	assert(key_pseudo->type != PSEUDO_INDEXED);

	int op = op_get;
	switch (container_type) {
	case RAVI_TTABLE:
		op = op_tget;
		break;
	case RAVI_TARRAYINT:
		op = op_iaget;
		break;
	case RAVI_TARRAYFLT:
		op = op_faget;
		break;
	default:
		break;
	}
	/* Note we rely upon ordering of enums here */
	switch (key_type) {
	case RAVI_TNUMINT:
		op++;
		break;
	case RAVI_TSTRING:
		assert(container_type != RAVI_TARRAYINT && container_type != RAVI_TARRAYFLT);
		op += 2;
		break;
	default:
		break;
	}
	Instruction *insn = allocate_instruction(proc, (enum opcode)op, line_number);
	Pseudo *tofree1 = add_instruction_operand(proc, insn, container_pseudo);
	Pseudo *tofree2 = add_instruction_operand(proc, insn, key_pseudo);
	free_temp_pseudo(proc, container_pseudo, false);
	free_temp_pseudo(proc, key_pseudo, false);
	index_pseudo->index_info.used = 1;
	if (tofree1)
		free_temp_pseudo(proc, tofree1, false);
	if (tofree2)
		free_temp_pseudo(proc, tofree2, false);
	Pseudo *target_pseudo = allocate_temp_pseudo(proc, target_type, true);
	add_instruction_target(proc, insn, target_pseudo);
	add_instruction(proc, insn);
	return target_pseudo;
}